

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

void __thiscall
helics::HandleManager::addHandleAtIndex
          (HandleManager *this,BasicHandleInfo *otherHandle,int32_t index)

{
  iterator *this_00;
  _Map_pointer ppBVar1;
  int iVar2;
  reference pBVar3;
  int iVar4;
  int iVar5;
  
  ppBVar1 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar2 = (int)((ulong)((long)ppBVar1 -
                       (long)(this->handles).
                             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3);
  iVar5 = (int)((long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * 0x286bca1b;
  iVar4 = (int)((long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * 0x286bca1b;
  if ((iVar2 - (uint)(ppBVar1 != (_Map_pointer)0x0)) * 3 + iVar4 + iVar5 == index) {
    addHandle(this,otherHandle);
    return;
  }
  this_00 = &(this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_start;
  if ((index < 0) ||
     ((int)(iVar4 + iVar5 + (iVar2 - (uint)(ppBVar1 != (_Map_pointer)0x0)) * 3) <= index)) {
    if (index < 1) {
      return;
    }
    std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::resize
              (&this->handles,(ulong)(uint)index + 1);
  }
  pBVar3 = std::
           _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
           ::operator[](this_00,(ulong)(uint)index);
  BasicHandleInfo::BasicHandleInfo(pBVar3,otherHandle);
  pBVar3 = std::
           _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
           ::operator[](this_00,(ulong)(uint)index);
  addSearchFields(this,pBVar3,index);
  return;
}

Assistant:

void HandleManager::addHandleAtIndex(const BasicHandleInfo& otherHandle, int32_t index)
{
    if (index == static_cast<int32_t>(handles.size())) {
        addHandle(otherHandle);
    } else if (isValidIndex(index, handles)) {
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    } else if (index > 0) {
        handles.resize(static_cast<size_t>(index) + 1);
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    }
}